

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int spng_set_phys(spng_ctx *ctx,spng_phys *phys)

{
  uint32_t uVar1;
  undefined3 uVar2;
  int iVar3;
  int ret;
  spng_phys *phys_local;
  spng_ctx *ctx_local;
  
  if ((ctx == (spng_ctx *)0x0) || (phys == (spng_phys *)0x0)) {
    ctx_local._4_4_ = 1;
  }
  else if ((ctx->data == (uchar *)0x0) && ((*(ushort *)&ctx->field_0xcc >> 4 & 1) == 0)) {
    ctx_local._4_4_ = 0x52;
  }
  else {
    ctx_local._4_4_ = read_chunks(ctx,0);
    if (ctx_local._4_4_ == 0) {
      iVar3 = check_phys(phys);
      if (iVar3 == 0) {
        uVar1 = phys->ppu_y;
        (ctx->phys).ppu_x = phys->ppu_x;
        (ctx->phys).ppu_y = uVar1;
        uVar2 = *(undefined3 *)&phys->field_0x9;
        (ctx->phys).unit_specifier = phys->unit_specifier;
        *(undefined3 *)&(ctx->phys).field_0x9 = uVar2;
        ctx->stored = (spng_chunk_bitfield)((uint)ctx->stored & 0xfffff7ff | 0x800);
        ctx->user = (spng_chunk_bitfield)((uint)ctx->user & 0xfffff7ff | 0x800);
        ctx_local._4_4_ = 0;
      }
      else {
        ctx_local._4_4_ = 0x37;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int spng_set_phys(spng_ctx *ctx, struct spng_phys *phys)
{
    SPNG_SET_CHUNK_BOILERPLATE(phys);

    if(check_phys(phys)) return SPNG_EPHYS;

    ctx->phys = *phys;

    ctx->stored.phys = 1;
    ctx->user.phys = 1;

    return 0;
}